

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<ClassInfoDef>::emplace<ClassInfoDef_const&>
          (QMovableArrayOps<ClassInfoDef> *this,qsizetype i,ClassInfoDef *args)

{
  ClassInfoDef **ppCVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  ClassInfoDef local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size == i
       ) {
      qVar4 = QArrayDataPointer<ClassInfoDef>::freeSpaceAtEnd
                        ((QArrayDataPointer<ClassInfoDef> *)this);
      if (qVar4 == 0) goto LAB_0012db03;
      ClassInfoDef::ClassInfoDef
                ((this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
                 ptr + (this->super_QGenericArrayOps<ClassInfoDef>).
                       super_QArrayDataPointer<ClassInfoDef>.size,args);
LAB_0012dbf2:
      pqVar2 = &(this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0012dbb1;
    }
LAB_0012db03:
    if (i == 0) {
      qVar4 = QArrayDataPointer<ClassInfoDef>::freeSpaceAtBegin
                        ((QArrayDataPointer<ClassInfoDef> *)this);
      if (qVar4 != 0) {
        ClassInfoDef::ClassInfoDef
                  ((this->super_QGenericArrayOps<ClassInfoDef>).
                   super_QArrayDataPointer<ClassInfoDef>.ptr + -1,args);
        ppCVar1 = &(this->super_QGenericArrayOps<ClassInfoDef>).
                   super_QArrayDataPointer<ClassInfoDef>.ptr;
        *ppCVar1 = *ppCVar1 + -1;
        goto LAB_0012dbf2;
      }
    }
  }
  local_58.value.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_58.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  ClassInfoDef::ClassInfoDef(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.size !=
          0;
  QArrayDataPointer<ClassInfoDef>::detachAndGrow
            ((QArrayDataPointer<ClassInfoDef> *)this,(uint)(i == 0 && bVar5),1,(ClassInfoDef **)0x0,
             (QArrayDataPointer<ClassInfoDef> *)0x0);
  if (i == 0 && bVar5) {
    ClassInfoDef::ClassInfoDef
              ((this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
               ptr + -1,&local_58);
    ppCVar1 = &(this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
               ptr;
    *ppCVar1 = *ppCVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<ClassInfoDef>).super_QArrayDataPointer<ClassInfoDef>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<ClassInfoDef> *)this,i,1);
    ClassInfoDef::ClassInfoDef(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  ClassInfoDef::~ClassInfoDef(&local_58);
LAB_0012dbb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }